

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O0

void __thiscall
highwayhash::DurationsForInputs::AddItem(DurationsForInputs *this,FuncInput input,float sample)

{
  Item *pIVar1;
  Item *item;
  size_t i;
  float sample_local;
  FuncInput input_local;
  DurationsForInputs *this_local;
  
  for (item = (Item *)0x0; item < (Item *)this->num_items; item = (Item *)((long)&item->input + 1))
  {
  }
  pIVar1 = this->items + this->num_items;
  pIVar1->input = input;
  pIVar1->num_durations = 1;
  *pIVar1->durations = sample;
  this->num_items = this->num_items + 1;
  return;
}

Assistant:

void DurationsForInputs::AddItem(const FuncInput input, const float sample) {
  for (size_t i = 0; i < num_items; ++i) {
    NANOBENCHMARK_CHECK(items[i].input != input);
  }
  Item& item = items[num_items];
  item.input = input;
  item.num_durations = 1;
  item.durations[0] = sample;
  ++num_items;
}